

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

uint16_t __thiscall CPU::get_mem16(CPU *this,oraddr_t memaddr)

{
  oraddr_t phys_addr;
  uint32_t uVar1;
  int iVar2;
  BUS_DEVICE *pBVar3;
  
  phys_addr = DMMU::dmmu_translate(&this->dmmu,memaddr,0);
  if ((this->dmmu).super_MMU.enabled != 0) {
    uVar1 = DCACHE::dc_simulate_read(&this->dcache,phys_addr,memaddr,2,(this->dmmu).data_ci);
    return (uint16_t)uVar1;
  }
  pBVar3 = BUS::get_device(this->bus_p,phys_addr);
  iVar2 = (*pBVar3->_vptr_BUS_DEVICE[1])
                    (pBVar3,(ulong)phys_addr,memaddr,pBVar3->_vptr_BUS_DEVICE[1]);
  return (uint16_t)iVar2;
}

Assistant:

uint16_t CPU::get_mem16(oraddr_t memaddr)
{
	oraddr_t phys_addr;
	uint16_t temp;
	BUS_DEVICE *device;

	phys_addr = dmmu.dmmu_translate(memaddr, 0);

	if(dmmu.enabled)
	{
		temp = dcache.dc_simulate_read(phys_addr, memaddr, 2, dmmu.data_ci);
	}
	else
	{
		device = bus_p->get_device(phys_addr);
		temp = device->Read16(phys_addr, memaddr);
	}
	

	return temp;
}